

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.h
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1(TPZCompElH1<pzshape::TPZShapePrism> *this)

{
  long *__s;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0197fa60;
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,&PTR_PTR_019796b8);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_019792e8;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01959e60;
  __s = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = __s;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 0x15;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  memset(__s,0xff,0xa8);
  this->fh1fam = EH1Standard;
  return;
}

Assistant:

TPZCompElH1() = default;